

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O1

bool dg::vr::RelationsAnalyzer::operandsEqual(ValueRelations *graph,I fst,I snd,bool sameOrder)

{
  uint uVar1;
  Relations RVar2;
  uint uVar3;
  uint uVar4;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  bool bVar11;
  ulong uVar5;
  
  uVar3 = *(uint *)(fst + 0x14) & 0x7ffffff;
  uVar5 = (ulong)uVar3;
  if (uVar3 == (*(uint *)(snd + 0x14) & 0x7ffffff)) {
    bVar11 = uVar3 == 0;
    if (!bVar11) {
      uVar4 = uVar3 << 5;
      uVar8 = 0;
      uVar9 = 1;
      uVar10 = 0;
      do {
        uVar3 = uVar3 - 1;
        uVar1 = uVar3;
        if (sameOrder) {
          uVar1 = uVar10;
        }
        if ((*(uint *)(fst + 0x14) >> 0x1e & 1) == 0) {
          lVar6 = (long)fst - (ulong)(*(uint *)(fst + 0x14) << 5);
        }
        else {
          lVar6 = *(long *)(fst + -8);
        }
        if ((*(uint *)(snd + 0x14) >> 0x1e & 1) == 0) {
          lVar7 = (long)snd - (ulong)(*(uint *)(snd + 0x14) << 5);
        }
        else {
          lVar7 = *(long *)(snd + -8);
        }
        RVar2 = ValueRelations::_between
                          (graph,*(V *)(lVar6 + uVar8),*(V *)(lVar7 + (ulong)uVar1 * 0x20));
        if (((ulong)RVar2.bits.super__Base_bitset<1UL>._M_w & 1) == 0) {
          return bVar11;
        }
        bVar11 = uVar5 <= uVar9;
        uVar10 = uVar10 + 1;
        uVar8 = uVar8 + 0x20;
        uVar9 = uVar9 + 1;
      } while (uVar4 != uVar8);
    }
  }
  else {
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool RelationsAnalyzer::operandsEqual(
        ValueRelations &graph, I fst, I snd,
        bool sameOrder) { // false means checking in reverse order
    unsigned total = fst->getNumOperands();
    if (total != snd->getNumOperands())
        return false;

    for (unsigned i = 0; i < total; ++i) {
        unsigned otherI = sameOrder ? i : total - i - 1;

        if (!graph.isEqual(fst->getOperand(i), snd->getOperand(otherI)))
            return false;
    }
    return true;
}